

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O1

void SoPlex_changeUpperReal(void *soplex,double *ub,int dim)

{
  Vector ubvec;
  VectorBase<double> local_28;
  
  ::soplex::VectorBase<double>::VectorBase(&local_28,dim,ub);
  ::soplex::SoPlexBase<double>::changeUpperReal((SoPlexBase<double> *)soplex,&local_28);
  if (local_28.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SoPlex_changeUpperReal(void* soplex, double* ub, int dim)
{
   SoPlex* so = (SoPlex*)(soplex);
   Vector ubvec(dim, ub);
   so->changeUpperReal(ubvec);
}